

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::check_quant_tables(jpeg_decoder *this)

{
  long in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  iVar1 = 0;
  while( true ) {
    if (*(int *)(in_RDI + 0x200) <= iVar1) {
      return;
    }
    if (*(long *)(in_RDI + 0x178 +
                 (long)*(int *)(in_RDI + 0x1c0 +
                               (long)*(int *)(in_RDI + 0x204 + (long)iVar1 * 4) * 4) * 8) == 0)
    break;
    iVar1 = iVar1 + 1;
  }
  stop_decoding((jpeg_decoder *)CONCAT44(iVar1,in_stack_fffffffffffffff0),
                (jpgd_status)((ulong)in_RDI >> 0x20));
}

Assistant:

void jpeg_decoder::check_quant_tables()
	{
		for (int i = 0; i < m_comps_in_scan; i++)
			if (m_quant[m_comp_quant[m_comp_list[i]]] == nullptr)
				stop_decoding(JPGD_UNDEFINED_QUANT_TABLE);
	}